

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t __size;
  uint uVar1;
  int *piVar2;
  float *pfVar3;
  long *plVar4;
  pointer piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Layer *pLVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  Mat *pMVar20;
  uint uVar21;
  size_type __n;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  float fVar30;
  int local_be0;
  long local_bd8;
  void *local_bc0;
  int local_ba0;
  void *ptr;
  Mat *pMStack_b90;
  Allocator *local_b88;
  int iStack_b80;
  undefined4 uStack_b7c;
  Allocator *local_b78;
  undefined4 local_b70;
  uint uStack_b6c;
  int iStack_b68;
  int iStack_b64;
  ulong local_b60;
  ulong local_b50;
  int local_b44;
  ulong local_b40;
  long local_b38;
  ulong local_b30;
  long local_b28;
  void *local_b20;
  int *local_b18;
  ulong local_b10;
  size_t local_b08;
  Allocator *local_b00;
  Mat local_af8;
  void *local_ab8;
  int *piStack_ab0;
  size_t local_aa8;
  int local_aa0;
  Allocator *local_a98;
  int local_a90;
  int iStack_a8c;
  int iStack_a88;
  int iStack_a84;
  size_t local_a80;
  void *local_a78;
  int *piStack_a70;
  size_t local_a68;
  int local_a60;
  Allocator *local_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  size_t local_a40;
  void *local_a38;
  Mat *pMStack_a30;
  Allocator *pAStack_a28;
  int iStack_a20;
  Allocator *local_a18;
  undefined4 local_a10;
  uint uStack_a0c;
  int iStack_a08;
  int iStack_a04;
  ulong local_a00;
  void *ptr_1;
  Allocator *pAStack_9f0;
  Allocator *local_9e8;
  undefined8 uStack_9e0;
  Allocator *local_9d8;
  undefined4 local_9d0;
  uint local_9cc;
  int local_9c8;
  undefined4 local_9c4;
  ulong local_9c0;
  void *local_9b8;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_998;
  int *local_990;
  ulong local_988;
  int local_980;
  Allocator *local_978;
  undefined4 local_970;
  int local_96c;
  int local_968;
  undefined4 local_964;
  ulong local_960;
  Option opt_g_1;
  ParamDict pd;
  
  pd.params[0].v.allocator._0_4_ = bottom_blob->dims;
  if (this->kernel_h == 1 && (this->kernel_w == 1 && (int)pd.params[0].v.allocator == 1)) {
    iVar15 = bottom_blob->w;
    if (iVar15 == this->weight_data_size / this->num_output) {
      pLVar9 = create_layer(0xf);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->num_output);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,this->weight_data_size);
      ParamDict::set(&pd,8,this->int8_scale_term);
      (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&local_af8.refcount + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_af8.elemsize + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_af8.data + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.refcount + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.allocator + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.dims + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.h + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.cstep + lVar10) = 0;
        lVar10 = lVar10 + 0x40;
      } while (lVar10 != 0x100);
      if (&local_af8 != &this->weight_data) {
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        if (local_af8.refcount != (int *)0x0) {
          LOCK();
          *local_af8.refcount = *local_af8.refcount + -1;
          UNLOCK();
          if (*local_af8.refcount == 0) {
            if (local_af8.allocator == (Allocator *)0x0) {
              if (local_af8.data != (void *)0x0) {
                free(local_af8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_af8.allocator + 0x18))();
            }
          }
        }
        local_af8.data = (this->weight_data).data;
        local_af8.refcount = (this->weight_data).refcount;
        local_af8.elemsize = (this->weight_data).elemsize;
        local_af8.elempack = (this->weight_data).elempack;
        local_af8.allocator = (this->weight_data).allocator;
        local_af8.dims = (this->weight_data).dims;
        local_af8.w = (this->weight_data).w;
        local_af8.h = (this->weight_data).h;
        local_af8.c = (this->weight_data).c;
        local_af8.cstep = (this->weight_data).cstep;
      }
      if ((Mat *)&local_ab8 != &this->bias_data) {
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        if (piStack_ab0 != (int *)0x0) {
          LOCK();
          *piStack_ab0 = *piStack_ab0 + -1;
          UNLOCK();
          if (*piStack_ab0 == 0) {
            if (local_a98 == (Allocator *)0x0) {
              if (local_ab8 != (void *)0x0) {
                free(local_ab8);
              }
            }
            else {
              (**(code **)(*(long *)local_a98 + 0x18))();
            }
          }
        }
        local_ab8 = (this->bias_data).data;
        piStack_ab0 = (this->bias_data).refcount;
        local_aa8 = (this->bias_data).elemsize;
        local_aa0 = (this->bias_data).elempack;
        local_a98 = (this->bias_data).allocator;
        local_a90 = (this->bias_data).dims;
        iStack_a8c = (this->bias_data).w;
        iStack_a88 = (this->bias_data).h;
        iStack_a84 = (this->bias_data).c;
        local_a80 = (this->bias_data).cstep;
      }
      if (this->int8_scale_term != 0) {
        if ((Mat *)&local_a78 != &this->weight_data_int8_scales) {
          piVar2 = (this->weight_data_int8_scales).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          if (piStack_a70 != (int *)0x0) {
            LOCK();
            *piStack_a70 = *piStack_a70 + -1;
            UNLOCK();
            if (*piStack_a70 == 0) {
              if (local_a58 == (Allocator *)0x0) {
                if (local_a78 != (void *)0x0) {
                  free(local_a78);
                }
              }
              else {
                (**(code **)(*(long *)local_a58 + 0x18))();
              }
            }
          }
          local_a78 = (this->weight_data_int8_scales).data;
          piStack_a70 = (this->weight_data_int8_scales).refcount;
          local_a68 = (this->weight_data_int8_scales).elemsize;
          local_a60 = (this->weight_data_int8_scales).elempack;
          local_a58 = (this->weight_data_int8_scales).allocator;
          local_a50._0_4_ = (this->weight_data_int8_scales).dims;
          local_a50._4_4_ = (this->weight_data_int8_scales).w;
          uStack_a48._0_4_ = (this->weight_data_int8_scales).h;
          uStack_a48._4_4_ = (this->weight_data_int8_scales).c;
          local_a40 = (this->weight_data_int8_scales).cstep;
        }
        ptr = &this->bottom_blob_int8_scale;
        pMStack_b90 = (Mat *)0x0;
        local_b88 = (Allocator *)0x4;
        iStack_b80 = 1;
        local_b78 = (Allocator *)0x0;
        local_b70 = 2;
        uStack_b6c = 1;
        iStack_b68 = 4;
        iStack_b64 = 1;
        local_b60 = 4;
        if (pMStack_a30 != (Mat *)0x0) {
          LOCK();
          *(int *)&pMStack_a30->data = *(int *)&pMStack_a30->data + -1;
          UNLOCK();
          if (*(int *)&pMStack_a30->data == 0) {
            if (local_a18 == (Allocator *)0x0) {
              if (local_a38 != (void *)0x0) {
                free(local_a38);
              }
            }
            else {
              (**(code **)(*(long *)local_a18 + 0x18))();
            }
          }
        }
        local_a38 = ptr;
        pMStack_a30 = pMStack_b90;
        pAStack_a28 = local_b88;
        iStack_a20 = iStack_b80;
        local_a18 = local_b78;
        local_a10 = local_b70;
        uStack_a0c = uStack_b6c;
        iStack_a08 = iStack_b68;
        iStack_a04 = iStack_b64;
        local_a00 = local_b60;
        if (pMStack_b90 != (Mat *)0x0) {
          LOCK();
          *(int *)&pMStack_b90->data = *(int *)&pMStack_b90->data + -1;
          UNLOCK();
          if (*(int *)&pMStack_b90->data == 0) {
            if (local_b78 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (**(code **)(*(long *)local_b78 + 0x18))();
            }
          }
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&ptr,&local_af8);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&ptr);
      ModelBin::~ModelBin((ModelBin *)&ptr);
      (*pLVar9->_vptr_Layer[4])(pLVar9,opt);
      (*pLVar9->_vptr_Layer[7])(pLVar9,bottom_blob,top_blob,opt);
      (*pLVar9->_vptr_Layer[1])(pLVar9);
      lVar10 = 0xc0;
      do {
        piVar2 = *(int **)((long)&local_af8.refcount + lVar10);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar11 = *(void **)((long)&local_af8.data + lVar10);
            plVar4 = *(long **)((long)&local_af8.allocator + lVar10);
            if (plVar4 == (long *)0x0) {
              if (pvVar11 != (void *)0x0) {
                free(pvVar11);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_af8.refcount + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_af8.elemsize + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_af8.data + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.refcount + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.dims + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.h + lVar10) = 0;
        *(undefined8 *)((long)&local_af8.cstep + lVar10) = 0;
        lVar10 = lVar10 + -0x40;
      } while (lVar10 != -0x40);
      lVar10 = 0x8c0;
      do {
        piVar2 = *(int **)((long)&pd.params[0].v.data + lVar10);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar11 = *(void **)((long)&pd.params[0].type + lVar10);
            plVar4 = *(long **)((long)&pd.params[0].v.elempack + lVar10);
            if (plVar4 == (long *)0x0) {
              if (pvVar11 != (void *)0x0) {
                free(pvVar11);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&pd.params[0].v.data + lVar10 + 4) = 0;
        *(undefined8 *)((long)&pd.params[0].v.refcount + lVar10 + 4) = 0;
        *(undefined8 *)((long)&pd.params[0].type + lVar10) = 0;
        *(undefined8 *)((long)&pd.params[0].v.data + lVar10) = 0;
        *(undefined8 *)((long)&pd.params[0].v.allocator + lVar10) = 0;
        *(undefined8 *)((long)&pd.params[0].v.dims + lVar10) = 0;
        *(undefined8 *)((long)&pd.params[0].v.h + lVar10) = 0;
        lVar10 = lVar10 + -0x48;
      } while (lVar10 != -0x40);
      return 0;
    }
  }
  else {
    iVar15 = bottom_blob->w;
  }
  iVar17 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  uVar22 = (ulong)uVar1;
  uVar28 = (this->kernel_w + -1) * this->dilation_w;
  piVar2 = (int *)bottom_blob->elemsize;
  uVar21 = (this->kernel_h + -1) * this->dilation_h;
  pd.params[0]._0_8_ = bottom_blob->data;
  pd.params[0].v.data = bottom_blob->refcount;
  pd.params[0].v.elemsize._0_4_ = bottom_blob->elempack;
  pd.params[0].v._24_8_ = bottom_blob->allocator;
  pd.params[0].v._48_8_ = bottom_blob->cstep;
  if ((int *)pd.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + 1;
    UNLOCK();
  }
  iVar6 = 0;
  pd.params[0].v.refcount = piVar2;
  pd.params[0].v.allocator._4_4_ = iVar15;
  pd.params[0].v.dims = iVar17;
  pd.params[0].v.w = uVar1;
  if ((piVar2 != (int *)0x1 & this->use_int8_inference) == 1) {
    local_af8.allocator = opt->workspace_allocator;
    local_af8.data = (void *)0x0;
    local_af8.refcount = (int *)0x0;
    local_af8.elemsize = 1;
    local_af8.elempack = 1;
    local_af8.dims = 3;
    iVar26 = local_af8.dims;
    local_af8.dims = 3;
    local_af8.cstep = (long)(iVar17 * iVar15) + 0xfU & 0xfffffffffffffff0;
    uVar19 = local_af8.cstep * (long)(int)uVar1;
    local_af8.h = iVar17;
    local_af8.c = uVar1;
    local_af8.w = iVar15;
    if (uVar19 == 0) {
      iVar6 = -100;
      local_af8.dims = iVar26;
      goto LAB_00127332;
    }
    if ((Mat *)local_af8.allocator == (Mat *)0x0) {
      ptr = (void *)0x0;
      iVar6 = posix_memalign(&ptr,0x10,uVar19 | 4);
      local_af8.data = (void *)0x0;
      if (iVar6 == 0) {
        local_af8.data = ptr;
      }
    }
    else {
      local_af8.data =
           (void *)(**(code **)((long)((Mat *)local_af8.allocator)->data + 0x10))
                             (local_af8.allocator,uVar19 | 4);
    }
    local_af8.refcount = (int *)((long)local_af8.data + uVar19);
    *(undefined4 *)((long)local_af8.data + uVar19) = 1;
    lVar10 = (long)local_af8.c * local_af8.cstep;
    if (lVar10 == 0) {
      iVar6 = -100;
    }
    else {
      ptr = *(void **)opt;
      local_b88 = opt->workspace_allocator;
      iStack_b80._0_1_ = opt->use_winograd_convolution;
      iStack_b80._1_1_ = opt->use_sgemm_convolution;
      iStack_b80._2_1_ = opt->use_int8_inference;
      iStack_b80._3_1_ = opt->use_vulkan_compute;
      uStack_b7c._0_1_ = opt->use_fp16_packed;
      uStack_b7c._1_1_ = opt->use_fp16_storage;
      uStack_b7c._2_1_ = opt->use_fp16_arithmetic;
      uStack_b7c._3_1_ = opt->use_int8_storage;
      local_b78 = *(Allocator **)&opt->use_int8_arithmetic;
      pMStack_b90 = (Mat *)local_af8.allocator;
      (*this->quantize->_vptr_Layer[7])(this->quantize,bottom_blob);
      if (local_af8.refcount != (int *)0x0) {
        LOCK();
        *local_af8.refcount = *local_af8.refcount + 1;
        UNLOCK();
      }
      if (pd.params[0].v.data != (void *)0x0) {
        LOCK();
        *(int *)pd.params[0].v.data = *pd.params[0].v.data + -1;
        UNLOCK();
        if (*pd.params[0].v.data == 0) {
          if (pd.params[0].v._24_8_ == 0) {
            if (pd.params[0]._0_8_ != 0) {
              free((void *)pd.params[0]._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)pd.params[0].v._24_8_ + 0x18))();
          }
        }
      }
      pd.params[0]._0_8_ = local_af8.data;
      pd.params[0].v.data = local_af8.refcount;
      pd.params[0].v.refcount = (int *)local_af8.elemsize;
      pd.params[0].v.elemsize._0_4_ = local_af8.elempack;
      pd.params[0].v._24_8_ = local_af8.allocator;
      pd.params[0].v.allocator._0_4_ = local_af8.dims;
      pd.params[0].v.allocator._4_4_ = local_af8.w;
      pd.params[0].v.dims = local_af8.h;
      pd.params[0].v.w = local_af8.c;
      pd.params[0].v.h = (undefined4)local_af8.cstep;
      pd.params[0].v.c = local_af8.cstep._4_4_;
      iVar6 = 0;
      if (local_af8.refcount == (int *)0x0) {
        iVar6 = 0;
        goto LAB_00125fc7;
      }
    }
    LOCK();
    *local_af8.refcount = *local_af8.refcount + -1;
    UNLOCK();
    if (*local_af8.refcount == 0) {
      if ((Mat *)local_af8.allocator == (Mat *)0x0) {
        if (local_af8.data != (void *)0x0) {
          free(local_af8.data);
        }
      }
      else {
        (**(code **)((long)*(void **)&(local_af8.allocator)->field_0x0 + 0x18))();
      }
    }
    if (lVar10 == 0) goto LAB_00127332;
  }
LAB_00125fc7:
  local_af8.data = (void *)pd.params[0]._0_8_;
  local_af8.refcount = (int *)pd.params[0].v.data;
  local_af8.elemsize = (size_t)pd.params[0].v.refcount;
  local_af8.elempack = (int)pd.params[0].v.elemsize;
  local_af8.allocator = (Allocator *)pd.params[0].v._24_8_;
  local_af8.dims = (int)pd.params[0].v.allocator;
  local_af8.w = pd.params[0].v.allocator._4_4_;
  local_af8.h = pd.params[0].v.dims;
  local_af8.c = pd.params[0].v.w;
  local_af8.cstep._0_4_ = pd.params[0].v.h;
  local_af8.cstep._4_4_ = pd.params[0].v.c;
  if (pd.params[0].v.data != (void *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + 1;
    UNLOCK();
  }
  iVar26 = this->pad_left;
  iVar7 = this->pad_right;
  if (((iVar7 < 1 && iVar26 < 1) && (iVar8 = this->pad_top, iVar8 < 1)) &&
     (iVar14 = this->pad_bottom, iVar14 < 1)) {
    if (iVar14 == -0xe9 && (iVar8 == -0xe9 && (iVar7 == -0xe9 && iVar26 == -0xe9))) {
      iVar26 = uVar28 - (iVar15 + -1) % this->stride_w;
      iVar15 = uVar21 - (iVar17 + -1) % this->stride_h;
      if ((0 < iVar26) || (0 < iVar15)) {
        local_b78 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        local_b88 = opt->workspace_allocator;
        iStack_b80._0_1_ = opt->use_winograd_convolution;
        iStack_b80._1_1_ = opt->use_sgemm_convolution;
        iStack_b80._2_1_ = opt->use_int8_inference;
        iStack_b80._3_1_ = opt->use_vulkan_compute;
        uStack_b7c._0_1_ = opt->use_fp16_packed;
        uStack_b7c._1_1_ = opt->use_fp16_storage;
        uStack_b7c._2_1_ = opt->use_fp16_arithmetic;
        uStack_b7c._3_1_ = opt->use_int8_storage;
        pMStack_b90 = (Mat *)opt->workspace_allocator;
        copy_make_border((Mat *)&pd,&local_af8,iVar15 / 2,iVar15 - iVar15 / 2,iVar26 / 2,
                         iVar26 - iVar26 / 2,0,this->pad_value,(Option *)&ptr);
      }
    }
    else if (iVar14 == -0xea && (iVar8 == -0xea && (iVar7 == -0xea && iVar26 == -0xea))) {
      iVar26 = uVar28 - (iVar15 + -1) % this->stride_w;
      iVar15 = uVar21 - (iVar17 + -1) % this->stride_h;
      if ((0 < iVar26) || (0 < iVar15)) {
        local_b78 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        local_b88 = opt->workspace_allocator;
        iStack_b80._0_1_ = opt->use_winograd_convolution;
        iStack_b80._1_1_ = opt->use_sgemm_convolution;
        iStack_b80._2_1_ = opt->use_int8_inference;
        iStack_b80._3_1_ = opt->use_vulkan_compute;
        uStack_b7c._0_1_ = opt->use_fp16_packed;
        uStack_b7c._1_1_ = opt->use_fp16_storage;
        uStack_b7c._2_1_ = opt->use_fp16_arithmetic;
        uStack_b7c._3_1_ = opt->use_int8_storage;
        pMStack_b90 = (Mat *)opt->workspace_allocator;
        copy_make_border((Mat *)&pd,&local_af8,iVar15 - iVar15 / 2,iVar15 / 2,iVar26 - iVar26 / 2,
                         iVar26 / 2,0,this->pad_value,(Option *)&ptr);
      }
    }
  }
  else {
    local_b78 = *(Allocator **)&opt->use_int8_arithmetic;
    ptr = *(void **)opt;
    local_b88 = opt->workspace_allocator;
    iStack_b80._0_1_ = opt->use_winograd_convolution;
    iStack_b80._1_1_ = opt->use_sgemm_convolution;
    iStack_b80._2_1_ = opt->use_int8_inference;
    iStack_b80._3_1_ = opt->use_vulkan_compute;
    uStack_b7c._0_1_ = opt->use_fp16_packed;
    uStack_b7c._1_1_ = opt->use_fp16_storage;
    uStack_b7c._2_1_ = opt->use_fp16_arithmetic;
    uStack_b7c._3_1_ = opt->use_int8_storage;
    pMStack_b90 = (Mat *)opt->workspace_allocator;
    copy_make_border((Mat *)&pd,&local_af8,this->pad_top,this->pad_bottom,iVar26,iVar7,0,
                     this->pad_value,(Option *)&ptr);
  }
  iVar17 = local_af8.w;
  iVar15 = -100;
  if ((local_af8.data != (void *)0x0) && ((long)local_af8.c * local_af8.cstep != 0)) {
    local_b38 = CONCAT44(local_b38._4_4_,iVar6);
    local_b10 = (long)(int)(~uVar28 + local_af8.w) / (long)this->stride_w & 0xffffffff;
    local_b50 = (long)(int)(~uVar21 + local_af8.h) / (long)this->stride_h & 0xffffffff;
    uVar21 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar21;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&ptr);
    piVar5 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = this->kernel_h;
    if (0 < iVar15) {
      iVar6 = this->dilation_h;
      iVar26 = this->kernel_w;
      iVar7 = this->dilation_w * iVar26;
      iVar8 = 0;
      iVar14 = 0;
      iVar16 = 0;
      do {
        if (0 < iVar26) {
          lVar10 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar8 + lVar10] = iVar14;
            iVar14 = iVar14 + this->dilation_w;
            iVar26 = this->kernel_w;
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 < iVar26);
          iVar8 = iVar8 + (int)lVar10;
          iVar15 = this->kernel_h;
        }
        iVar14 = iVar14 + (iVar17 * iVar6 - iVar7);
        iVar16 = iVar16 + 1;
      } while (iVar16 < iVar15);
    }
    uVar28 = (int)local_b10 + 1;
    iVar17 = (int)local_b50 + 1;
    if (this->use_int8_inference == false) {
      Mat::create(top_blob,uVar28,iVar17,this->num_output,(size_t)piVar2,opt->blob_allocator);
      local_9b8 = top_blob->data;
      iVar15 = -100;
      if ((local_9b8 != (void *)0x0) &&
         (local_b08 = top_blob->cstep, (long)top_blob->c * local_b08 != 0)) {
        local_b38 = (long)this->num_output;
        if (0 < local_b38) {
          local_b08 = local_b08 * top_blob->elemsize;
          local_b00 = (Allocator *)(long)(int)uVar28;
          uVar19 = (ulong)uVar28;
          local_b44 = uVar21 * uVar1;
          local_b30 = 0;
          local_bd8 = 0;
          local_b40 = uVar19;
          do {
            if (-1 < (int)local_b50) {
              lVar10 = (long)(int)local_b30;
              local_bc0 = (void *)(local_b08 * local_bd8 + (long)local_9b8);
              iVar15 = this->bias_term;
              iVar17 = this->activation_type;
              pvVar11 = (this->weight_data).data;
              iVar6 = 0;
              do {
                if (-1 < (int)local_b10) {
                  pfVar3 = (float *)(this->activation_params).data;
                  local_b18 = (int *)(this->bias_data).data;
                  lVar13 = local_af8.cstep * local_af8.elemsize;
                  local_b20 = (void *)((long)(local_af8.w * iVar6 * this->stride_h) *
                                       local_af8.elemsize + (long)local_af8.data);
                  local_b28 = (long)this->stride_w;
                  uVar12 = 0;
                  do {
                    if (iVar15 == 0) {
                      fVar30 = 0.0;
                    }
                    else {
                      fVar30 = (float)local_b18[local_bd8];
                    }
                    if (0 < (int)uVar1) {
                      uVar27 = 0;
                      pvVar24 = (void *)(lVar10 * 4 + (long)pvVar11);
                      do {
                        if (0 < (int)uVar21) {
                          uVar23 = 0;
                          do {
                            fVar30 = fVar30 + *(float *)((long)pvVar24 + uVar23 * 4) *
                                              *(float *)((long)local_b20 +
                                                        (long)piVar5[uVar23] * 4 +
                                                        lVar13 * uVar27 + uVar12 * local_b28 * 4);
                            uVar23 = uVar23 + 1;
                          } while (uVar21 != uVar23);
                        }
                        uVar27 = uVar27 + 1;
                        pvVar24 = (void *)((long)pvVar24 + __n * 4);
                      } while (uVar27 != uVar22);
                    }
                    switch(iVar17) {
                    case 1:
                      if (fVar30 <= 0.0) {
                        fVar30 = 0.0;
                      }
                      break;
                    case 2:
                      fVar30 = fVar30 * (float)(~-(uint)(0.0 < fVar30) & (uint)*pfVar3 |
                                               -(uint)(0.0 < fVar30) & 0x3f800000);
                      break;
                    case 3:
                      if (fVar30 <= *pfVar3) {
                        fVar30 = *pfVar3;
                      }
                      if (pfVar3[1] < fVar30) {
                        fVar30 = pfVar3[1];
                      }
                      break;
                    case 4:
                      fVar30 = expf(-fVar30);
                      uVar19 = local_b40;
                      fVar30 = 1.0 / (fVar30 + 1.0);
                    }
                    *(float *)((long)local_bc0 + uVar12 * 4) = fVar30;
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != uVar19);
                }
                local_bc0 = (void *)((long)local_bc0 + (long)local_b00 * 4);
                bVar29 = iVar6 != (int)local_b50;
                iVar6 = iVar6 + 1;
              } while (bVar29);
            }
            local_bd8 = local_bd8 + 1;
            local_b30 = (ulong)(uint)((int)local_b30 + local_b44);
          } while (local_bd8 != local_b38);
        }
LAB_001272d3:
        iVar15 = 0;
      }
    }
    else if (this->use_int8_requantize == true) {
      iStack_b64 = this->num_output;
      local_b78 = opt->workspace_allocator;
      ptr = (void *)0x0;
      pMStack_b90 = (Mat *)0x0;
      local_b88 = (Allocator *)0x4;
      iStack_b80 = 1;
      local_b70 = 3;
      uVar25 = iVar17 * uVar28;
      local_b60 = (long)(int)uVar25 + 3U & 0x3ffffffffffffffc;
      lVar10 = local_b60 * (long)iStack_b64;
      uStack_b6c = uVar28;
      iStack_b68 = iVar17;
      if (lVar10 == 0) {
        iVar15 = -100;
      }
      else {
        __size = lVar10 * 4 + 4;
        local_b30 = (ulong)uVar25;
        if (local_b78 == (Allocator *)0x0) {
          ptr_1 = (void *)0x0;
          iVar15 = posix_memalign(&ptr_1,0x10,__size);
          ptr = (void *)0x0;
          if (iVar15 == 0) {
            ptr = ptr_1;
          }
        }
        else {
          ptr = (void *)(**(code **)(*(long *)local_b78 + 0x10))(local_b78,__size);
        }
        pMVar20 = (Mat *)((long)ptr + lVar10 * 4);
        *(undefined4 *)((long)ptr + lVar10 * 4) = 1;
        pMStack_b90 = pMVar20;
        Mat::create(top_blob,uVar28,iVar17,this->num_output,1,opt->blob_allocator);
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          bVar29 = false;
          local_b38 = CONCAT44(local_b38._4_4_,0xffffff9c);
        }
        else if (this->num_output < 1) {
          bVar29 = true;
        }
        else {
          local_b44 = uVar21 * uVar1;
          local_b28 = (long)(int)uVar28;
          lVar10 = 0;
          do {
            local_b00 = local_b88;
            local_b40 = local_b60 * lVar10 * (long)local_b88;
            if (-1 < (int)local_b50) {
              pvVar11 = (void *)((long)ptr + local_b40);
              local_ba0 = (int)lVar10;
              local_b20 = (void *)((long)(local_b44 * local_ba0) + (long)(this->weight_data).data);
              local_be0 = 0;
              do {
                if (-1 < (int)local_b10) {
                  local_b18 = (int *)local_af8.elemsize;
                  uVar19 = 0;
                  do {
                    if ((int)uVar1 < 1) {
                      iVar15 = 0;
                    }
                    else {
                      uVar12 = 0;
                      iVar15 = 0;
                      pvVar24 = local_b20;
                      do {
                        if (0 < (int)uVar21) {
                          uVar27 = 0;
                          do {
                            iVar15 = iVar15 + (int)*(char *)((long)pvVar24 + uVar27) *
                                              (int)*(char *)((long)local_af8.data +
                                                            (long)piVar5[uVar27] +
                                                            local_af8.cstep * local_af8.elemsize *
                                                            uVar12 + (long)(local_af8.w * local_be0
                                                                           * this->stride_h) *
                                                                     local_af8.elemsize +
                                                                     (long)(int)uVar19 *
                                                                     (long)this->stride_w);
                            uVar27 = uVar27 + 1;
                          } while (uVar21 != uVar27);
                        }
                        pvVar24 = (void *)((long)pvVar24 + __n);
                        uVar12 = uVar12 + 1;
                      } while (uVar12 != uVar22);
                    }
                    *(int *)((long)pvVar11 + uVar19 * 4) = iVar15;
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != uVar28);
                }
                pvVar11 = (void *)((long)pvVar11 + local_b28 * 4);
                bVar29 = local_be0 != (int)local_b50;
                local_be0 = local_be0 + 1;
              } while (bVar29);
            }
            opt_g_1.lightmode = opt->lightmode;
            opt_g_1._1_3_ = *(undefined3 *)&opt->field_0x1;
            opt_g_1.workspace_allocator = opt->workspace_allocator;
            opt_g_1.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g_1.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g_1.use_int8_inference = opt->use_int8_inference;
            opt_g_1.use_vulkan_compute = opt->use_vulkan_compute;
            opt_g_1.use_fp16_packed = opt->use_fp16_packed;
            opt_g_1.use_fp16_storage = opt->use_fp16_storage;
            opt_g_1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_g_1.use_int8_storage = opt->use_int8_storage;
            opt_g_1.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_g_1.use_packing_layout = opt->use_packing_layout;
            opt_g_1._34_6_ = *(undefined6 *)&opt->field_0x22;
            opt_g_1.num_threads = 1;
            local_978 = top_blob->allocator;
            ptr_1 = (void *)((long)ptr + local_b40);
            pAStack_9f0 = (Allocator *)0x0;
            local_9e8 = local_b88;
            uStack_9e0 = CONCAT44(uStack_9e0._4_4_,iStack_b80);
            local_9d8 = local_b78;
            local_9d0 = 3;
            local_9cc = uStack_b6c;
            local_9c8 = iStack_b68;
            local_9c4 = 1;
            local_9c0 = ((long)(int)(iStack_b68 * uStack_b6c) * (long)local_b88 + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_b88;
            local_96c = top_blob->w;
            local_988 = top_blob->elemsize;
            local_998 = (void *)(top_blob->cstep * lVar10 * local_988 + (long)top_blob->data);
            local_968 = top_blob->h;
            local_980 = top_blob->elempack;
            local_990 = (int *)0x0;
            local_970 = 3;
            local_964 = 1;
            local_960 = ((long)(local_968 * local_96c) * local_988 + 0xf & 0xfffffffffffffff0) /
                        local_988;
            pLVar9 = (this->requantize_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
            opt_g_1.blob_allocator = local_978;
            (*pLVar9->_vptr_Layer[7])(pLVar9,&ptr_1,&local_998);
            if (local_990 != (int *)0x0) {
              LOCK();
              *local_990 = *local_990 + -1;
              UNLOCK();
              if (*local_990 == 0) {
                if (local_978 == (Allocator *)0x0) {
                  if (local_998 != (void *)0x0) {
                    free(local_998);
                  }
                }
                else {
                  (**(code **)(*(long *)local_978 + 0x18))();
                }
              }
            }
            if (pAStack_9f0 != (Allocator *)0x0) {
              LOCK();
              *(int *)pAStack_9f0 = *(int *)pAStack_9f0 + -1;
              UNLOCK();
              if (*(int *)pAStack_9f0 == 0) {
                if (local_9d8 == (Allocator *)0x0) {
                  if (ptr_1 != (void *)0x0) {
                    free(ptr_1);
                  }
                }
                else {
                  (**(code **)(*(long *)local_9d8 + 0x18))();
                }
              }
            }
            if ((this->activation_type == 1) && (0 < (int)local_b30)) {
              lVar13 = top_blob->elemsize * top_blob->cstep * lVar10;
              pvVar11 = top_blob->data;
              uVar19 = 0;
              do {
                if (*(char *)((long)pvVar11 + uVar19 + lVar13) < '\0') {
                  *(undefined1 *)((long)pvVar11 + uVar19 + lVar13) = 0;
                }
                uVar19 = uVar19 + 1;
              } while (local_b30 != uVar19);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < this->num_output);
          bVar29 = true;
          pMVar20 = pMStack_b90;
          if (pMStack_b90 == (Mat *)0x0) goto LAB_001272d3;
        }
        LOCK();
        *(int *)&pMVar20->data = *(int *)&pMVar20->data + -1;
        UNLOCK();
        iVar15 = (int)local_b38;
        if (*(int *)&pMVar20->data == 0) {
          if (local_b78 == (Allocator *)0x0) {
            if (ptr != (void *)0x0) {
              free(ptr);
            }
          }
          else {
            (**(code **)(*(long *)local_b78 + 0x18))();
          }
        }
        if (bVar29) goto LAB_001272d3;
      }
    }
    else {
      Mat::create(top_blob,uVar28,iVar17,this->num_output,4,opt->blob_allocator);
      iVar15 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (0 < this->num_output) {
          local_b40 = CONCAT44(local_b40._4_4_,uVar21 * uVar1);
          local_b28 = (long)(int)uVar28;
          lVar10 = 0;
          do {
            pvVar11 = top_blob->data;
            local_b88 = (Allocator *)top_blob->elemsize;
            sVar18 = top_blob->cstep;
            if (-1 < (int)local_b50) {
              pvVar11 = (void *)((long)pvVar11 + sVar18 * lVar10 * (long)local_b88);
              local_b20 = (void *)((long)((int)local_b40 * (int)lVar10) +
                                  (long)(this->weight_data).data);
              local_be0 = 0;
              do {
                if (-1 < (int)local_b10) {
                  local_b18 = (int *)local_af8.elemsize;
                  uVar19 = 0;
                  do {
                    if ((int)uVar1 < 1) {
                      iVar15 = 0;
                    }
                    else {
                      uVar12 = 0;
                      iVar15 = 0;
                      pvVar24 = local_b20;
                      do {
                        if (0 < (int)uVar21) {
                          uVar27 = 0;
                          do {
                            iVar15 = iVar15 + (int)*(char *)((long)pvVar24 + uVar27) *
                                              (int)*(char *)((long)local_af8.data +
                                                            (long)piVar5[uVar27] +
                                                            local_af8.cstep * local_af8.elemsize *
                                                            uVar12 + (long)(local_af8.w * local_be0
                                                                           * this->stride_h) *
                                                                     local_af8.elemsize +
                                                                     (long)(int)uVar19 *
                                                                     (long)this->stride_w);
                            uVar27 = uVar27 + 1;
                          } while (uVar21 != uVar27);
                        }
                        pvVar24 = (void *)((long)pvVar24 + __n);
                        uVar12 = uVar12 + 1;
                      } while (uVar12 != uVar22);
                    }
                    *(int *)((long)pvVar11 + uVar19 * 4) = iVar15;
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != uVar28);
                }
                pvVar11 = (void *)((long)pvVar11 + local_b28 * 4);
                bVar29 = local_be0 != (int)local_b50;
                local_be0 = local_be0 + 1;
              } while (bVar29);
              pvVar11 = top_blob->data;
              local_b88 = (Allocator *)top_blob->elemsize;
              sVar18 = top_blob->cstep;
            }
            local_9e8 = opt->workspace_allocator;
            uStack_9e0._0_1_ = opt->use_winograd_convolution;
            uStack_9e0._1_1_ = opt->use_sgemm_convolution;
            uStack_9e0._2_1_ = opt->use_int8_inference;
            uStack_9e0._3_1_ = opt->use_vulkan_compute;
            uStack_9e0._4_1_ = opt->use_fp16_packed;
            uStack_9e0._5_1_ = opt->use_fp16_storage;
            uStack_9e0._6_1_ = opt->use_fp16_arithmetic;
            uStack_9e0._7_1_ = opt->use_int8_storage;
            local_9d8 = *(Allocator **)&opt->use_int8_arithmetic;
            ptr_1 = (void *)CONCAT44(1,*(undefined4 *)opt);
            local_b78 = top_blob->allocator;
            iStack_b80 = top_blob->elempack;
            uStack_b6c = top_blob->w;
            iStack_b68 = top_blob->h;
            ptr = (void *)(sVar18 * lVar10 * (long)local_b88 + (long)pvVar11);
            pMStack_b90 = (Mat *)0x0;
            local_b70 = 3;
            iStack_b64 = 1;
            local_b60 = ((long)(int)(iStack_b68 * uStack_b6c) * (long)local_b88 + 0xfU &
                        0xfffffffffffffff0) / (ulong)local_b88;
            pLVar9 = (this->dequantize_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10];
            pAStack_9f0 = local_b78;
            (*pLVar9->_vptr_Layer[9])(pLVar9,&ptr,&ptr_1);
            if (pMStack_b90 != (Mat *)0x0) {
              LOCK();
              *(int *)&pMStack_b90->data = *(int *)&pMStack_b90->data + -1;
              UNLOCK();
              if (*(int *)&pMStack_b90->data == 0) {
                if (local_b78 == (Allocator *)0x0) {
                  if (ptr != (void *)0x0) {
                    free(ptr);
                  }
                }
                else {
                  (**(code **)(*(long *)local_b78 + 0x18))();
                }
              }
            }
            if ((this->activation_type == 1) && (0 < (int)(iVar17 * uVar28))) {
              lVar13 = top_blob->elemsize * top_blob->cstep * lVar10;
              pvVar11 = top_blob->data;
              uVar19 = 0;
              do {
                fVar30 = *(float *)((long)pvVar11 + uVar19 * 4 + lVar13);
                if (fVar30 <= 0.0) {
                  fVar30 = 0.0;
                }
                *(float *)((long)pvVar11 + uVar19 * 4 + lVar13) = fVar30;
                uVar19 = uVar19 + 1;
              } while (iVar17 * uVar28 != uVar19);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < this->num_output);
        }
        goto LAB_001272d3;
      }
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  iVar6 = iVar15;
  if (local_af8.refcount != (int *)0x0) {
    LOCK();
    *local_af8.refcount = *local_af8.refcount + -1;
    UNLOCK();
    if (*local_af8.refcount == 0) {
      if ((Mat *)local_af8.allocator == (Mat *)0x0) {
        if (local_af8.data != (void *)0x0) {
          free(local_af8.data);
        }
      }
      else {
        (**(code **)((long)*(void **)&(local_af8.allocator)->field_0x0 + 0x18))();
      }
    }
  }
LAB_00127332:
  if (pd.params[0].v.data != (void *)0x0) {
    LOCK();
    *(int *)pd.params[0].v.data = *pd.params[0].v.data + -1;
    UNLOCK();
    if (*pd.params[0].v.data == 0) {
      if (pd.params[0].v._24_8_ == 0) {
        if (pd.params[0]._0_8_ != 0) {
          free((void *)pd.params[0]._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)pd.params[0].v._24_8_ + 0x18))();
      }
    }
  }
  return iVar6;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob_tm.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // requantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }       

                // activation relu
                if (activation_type == 1)
                {
                    signed char* outptr_s8 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        if (outptr_s8[i] < 0)
                            outptr_s8[i] = 0;
                    }
                }                                 
            }
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
      
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                int* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                        // channels
                        for (int q=0; q<channels; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                int val = sptr[ space_ofs[k] ];
                                int w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }

                // activation relu
                if (activation_type == 1)
                {
                    float* outptr_fp32 = top_blob.channel(p);

                    for (int i = 0; i < outh*outw; i++)
                    {
                        outptr_fp32[i] = std::max(outptr_fp32[i], 0.f);
                    }
                }
            }   
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = 1.f / (1.f + exp(-sum));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}